

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChGaussIntegrationRule.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChGaussIntegrationRule::SetIntOnSquare
          (ChGaussIntegrationRule *this,int nPoints,
          vector<chrono::fea::ChGaussPoint_*,_std::allocator<chrono::fea::ChGaussPoint_*>_>
          *GpVector)

{
  double dVar1;
  double dVar2;
  ChGaussPoint *pCVar3;
  ChLog *this_00;
  ChStreamOutAscii *this_01;
  long lVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  vector<double,_std::allocator<double>_> w;
  vector<double,_std::allocator<double>_> c;
  ChVector<double> coord;
  
  coord.m_data[2] = 0.0;
  c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  w.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  coord.m_data[0] = 0.0;
  coord.m_data[1] = 0.0;
  c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  w.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  w.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  std::vector<chrono::fea::ChGaussPoint_*,_std::allocator<chrono::fea::ChGaussPoint_*>_>::resize
            (GpVector,(long)nPoints);
  if (nPoints == 1) {
    coord.m_data[0] = 0.0;
    coord.m_data[1] = 0.0;
    pCVar3 = (ChGaussPoint *)::operator_new(0xa0);
    ChGaussPoint::ChGaussPoint(pCVar3,1,&coord,4.0);
    *(GpVector->
     super__Vector_base<chrono::fea::ChGaussPoint_*,_std::allocator<chrono::fea::ChGaussPoint_*>_>).
     _M_impl.super__Vector_impl_data._M_start = pCVar3;
  }
  else if (nPoints == 4) {
    std::vector<double,_std::allocator<double>_>::resize(&c,2);
    std::vector<double,_std::allocator<double>_>::resize(&w,2);
    *c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
         = -0.577350269189626;
    c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
    [1] = 0.577350269189626;
    *w.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
         = 1.0;
    w.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
    [1] = 1.0;
    iVar5 = 1;
    lVar6 = 0;
    for (lVar4 = 0; lVar4 != 2; lVar4 = lVar4 + 1) {
      for (lVar7 = 0; lVar7 != 2; lVar7 = lVar7 + 1) {
        coord.m_data[0] =
             c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[lVar4];
        coord.m_data[1] =
             c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[lVar7];
        dVar1 = w.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar4];
        dVar2 = w.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar7];
        pCVar3 = (ChGaussPoint *)::operator_new(0xa0);
        ChGaussPoint::ChGaussPoint(pCVar3,iVar5 + (int)lVar7,&coord,dVar2 * dVar1);
        *(ChGaussPoint **)
         ((long)(GpVector->
                super__Vector_base<chrono::fea::ChGaussPoint_*,_std::allocator<chrono::fea::ChGaussPoint_*>_>
                )._M_impl.super__Vector_impl_data._M_start + lVar7 * 8 + lVar6) = pCVar3;
      }
      iVar5 = iVar5 + 2;
      lVar6 = lVar6 + 0x10;
    }
  }
  else if (nPoints == 9) {
    std::vector<double,_std::allocator<double>_>::resize(&c,3);
    std::vector<double,_std::allocator<double>_>::resize(&w,3);
    *c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
         = -0.774596669241483;
    c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
    [1] = 0.0;
    c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
    [2] = 0.774596669241483;
    *w.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
         = 0.555555555555555;
    w.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
    [1] = 0.888888888888888;
    w.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
    [2] = 0.555555555555555;
    iVar5 = 1;
    lVar6 = 0;
    for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
      for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
        coord.m_data[0] =
             c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[lVar4];
        coord.m_data[1] =
             c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[lVar7];
        dVar1 = w.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar4];
        dVar2 = w.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar7];
        pCVar3 = (ChGaussPoint *)::operator_new(0xa0);
        ChGaussPoint::ChGaussPoint(pCVar3,iVar5 + (int)lVar7,&coord,dVar2 * dVar1);
        *(ChGaussPoint **)
         ((long)(GpVector->
                super__Vector_base<chrono::fea::ChGaussPoint_*,_std::allocator<chrono::fea::ChGaussPoint_*>_>
                )._M_impl.super__Vector_impl_data._M_start + lVar7 * 8 + lVar6) = pCVar3;
      }
      iVar5 = iVar5 + 3;
      lVar6 = lVar6 + 0x18;
    }
  }
  else if (nPoints == 0x10) {
    std::vector<double,_std::allocator<double>_>::resize(&c,4);
    std::vector<double,_std::allocator<double>_>::resize(&w,4);
    *c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
         = -0.861136311594053;
    c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
    [1] = -0.339981043584856;
    c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
    [2] = 0.339981043584856;
    c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
    [3] = 0.861136311594053;
    *w.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
         = 0.347854845137454;
    w.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
    [1] = 0.652145154862546;
    w.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
    [2] = 0.652145154862546;
    w.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
    [3] = 0.347854845137454;
    iVar5 = 1;
    lVar6 = 0;
    for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
      for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
        coord.m_data[0] =
             c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[lVar4];
        coord.m_data[1] =
             c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[lVar7];
        dVar1 = w.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar4];
        dVar2 = w.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar7];
        pCVar3 = (ChGaussPoint *)::operator_new(0xa0);
        ChGaussPoint::ChGaussPoint(pCVar3,iVar5 + (int)lVar7,&coord,dVar2 * dVar1);
        *(ChGaussPoint **)
         ((long)(GpVector->
                super__Vector_base<chrono::fea::ChGaussPoint_*,_std::allocator<chrono::fea::ChGaussPoint_*>_>
                )._M_impl.super__Vector_impl_data._M_start + lVar7 * 8 + lVar6) = pCVar3;
      }
      iVar5 = iVar5 + 4;
      lVar6 = lVar6 + 0x20;
    }
  }
  else {
    this_00 = GetLog();
    this_01 = ChStreamOutAscii::operator<<
                        (&this_00->super_ChStreamOutAscii,
                         "SetIntOnCube: unsupported number of integration points: ");
    ChStreamOutAscii::operator<<(this_01,nPoints);
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&w.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&c.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

void ChGaussIntegrationRule::SetIntOnSquare(int nPoints, std::vector<ChGaussPoint*>* GpVector) {
    int i, j;
    double weight;
    ChVector<> coord;
    std::vector<double> c, w;

    // Resize the vector containing Gauss Points
    // GpVector = new std::vector<ChGaussPoint> [ nPoints ];
    (*GpVector).resize(nPoints);

    switch (nPoints) {
        case 1:

            coord.x() = 0.0;
            coord.y() = 0.0;
            weight = 4.0;
            (*GpVector)[0] = new ChGaussPoint(1, &coord, weight);
            break;

        case 4:

            c.resize(2);
            w.resize(2);
            c[0] = -0.577350269189626;
            c[1] = 0.577350269189626;

            w[0] = 1.0;
            w[1] = 1.0;

            for (i = 0; i < 2; i++) {
                for (j = 0; j < 2; j++) {
                    coord.x() = c[i];
                    coord.y() = c[j];
                    weight = w[i] * w[j];
                    // ChGaussPoint* my_gp = new ChGaussPoint( 4 *i + 2 *j + k , &coord, weight);
                    (*GpVector)[2 * i + j] = new ChGaussPoint(2 * i + j + 1, &coord, weight);
                }
            }

            break;

        case 9:

            c.resize(3);
            w.resize(3);
            c[0] = -0.774596669241483;
            c[1] = 0.0;
            c[2] = 0.774596669241483;

            w[0] = 0.555555555555555;
            w[1] = 0.888888888888888;
            w[2] = 0.555555555555555;

            for (i = 0; i < 3; i++) {
                for (j = 0; j < 3; j++) {
                    coord.x() = c[i];
                    coord.y() = c[j];
                    weight = w[i] * w[j];
                    (*GpVector)[3 * i + j] = new ChGaussPoint(3 * i + j + 1, &coord, weight);
                }
            }

            break;

        case 16:

            c.resize(4);
            w.resize(4);
            c[0] = -0.861136311594053;
            c[1] = -0.339981043584856;
            c[2] = 0.339981043584856;
            c[3] = 0.861136311594053;

            w[0] = 0.347854845137454;
            w[1] = 0.652145154862546;
            w[2] = 0.652145154862546;
            w[3] = 0.347854845137454;

            for (i = 0; i < 4; i++) {
                for (j = 0; j < 4; j++) {
                    coord.x() = c[i];
                    coord.y() = c[j];
                    weight = w[i] * w[j];
                    (*GpVector)[4 * i + j] = new ChGaussPoint(4 * i + j + 1, &coord, weight);
                }
            }

            break;

        default:
            GetLog() << "SetIntOnCube: unsupported number of integration points: " << nPoints;

    }  //__end of Switch
}